

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRBitMatrixParser.cpp
# Opt level: O3

ByteArray *
ZXing::QRCode::ReadCodewords
          (ByteArray *__return_storage_ptr__,BitMatrix *bitMatrix,Version *version,
          FormatInformation *formatInfo)

{
  int y;
  int x;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ByteArray *pBVar4;
  invalid_argument *piVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  byte *pbVar14;
  uint uVar15;
  byte bVar16;
  bool bVar17;
  byte bVar18;
  uint8_t currentByte;
  BitMatrix functionPattern;
  byte local_f5;
  uint local_f4;
  ulong local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  BitMatrix *local_d0;
  BitMatrix local_c8;
  ulong local_a0;
  FormatInformation *local_98;
  ulong local_90;
  ulong local_88;
  ByteArray *local_80;
  ulong local_78;
  uint local_6c;
  ulong local_68;
  Version *local_60;
  uint local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  local_d0 = bitMatrix;
  local_98 = formatInfo;
  local_80 = __return_storage_ptr__;
  local_60 = version;
  switch(version->_type) {
  case Model1:
    local_c8._0_8_ = (byte *)0x0;
    local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (byte *)0x0;
    local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
               (long)version->_totalCodewords);
    uVar10 = local_d0->_height;
    local_68 = (ulong)uVar10;
    uVar15 = uVar10;
    if ((int)uVar10 < 0) {
      uVar15 = uVar10 + 3;
    }
    if (-0xc < (int)uVar10) {
      local_54 = ((int)uVar15 >> 2) + 3;
      uVar9 = (int)uVar10 / 2;
      local_78 = (ulong)uVar9;
      local_38 = (ulong)(((int)uVar15 >> 2) - 2);
      iVar13 = uVar10 - 0xd;
      if (-1 < (int)(uVar10 - 0x10)) {
        iVar13 = uVar10 - 0x10;
      }
      local_90 = CONCAT44(local_90._4_4_,uVar9 - 4);
      local_6c = iVar13 >> 2;
      iVar13 = uVar10 - 5;
      if (-1 < (int)(uVar10 - 8)) {
        iVar13 = uVar10 - 8;
      }
      uVar15 = iVar13 >> 2;
      if ((int)local_6c < 2) {
        local_6c = 1;
      }
      local_44 = uVar15 - 1;
      if ((int)uVar15 < 2) {
        uVar15 = 1;
      }
      local_88 = (ulong)uVar15;
      local_4c = uVar9 - 3;
      local_50 = 1;
      if (1 < (int)local_54) {
        local_50 = local_54;
      }
      local_a0 = CONCAT44(local_a0._4_4_,uVar10 - 9);
      uVar12 = 0;
      local_48 = uVar10 + 3;
      do {
        uVar15 = (uint)uVar12;
        local_f0 = uVar12;
        if (uVar15 < 2) {
          if (0xb < (int)local_68) {
            uVar9 = 0;
            do {
              if (((((int)uVar12 != 0) || (uVar9 == 0)) || ((uVar9 & 1) != 0)) ||
                 (local_44 <= (int)uVar9)) {
                local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((ulong)local_e8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00
                              );
                uVar12 = 0;
                do {
                  if (7 < formatInfo->dataMask) {
                    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument(piVar5,"QRCode maskIndex out of range");
                    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  uVar8 = (uVar10 - 1) - ((uint)uVar12 & 1 | uVar15 * 2);
                  uVar7 = (uVar10 - 1) - ((int)(uVar12 >> 1) + uVar9 * 4);
                  switch(formatInfo->dataMask) {
                  case '\0':
                    bVar17 = (uVar7 + uVar8 & 1) == 0;
                    break;
                  case '\x01':
                    bVar17 = (uVar7 & 1) == 0;
                    break;
                  case '\x02':
                    uVar6 = uVar8;
                    goto LAB_00180c52;
                  case '\x03':
                    uVar6 = uVar7 + uVar8;
LAB_00180c52:
                    bVar17 = uVar6 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                    break;
                  case '\x04':
                    uVar6 = uVar7 - ((int)uVar7 >> 0x1f) >> 1;
                    iVar13 = (int)uVar8 / 3;
                    goto LAB_00180c85;
                  case '\x05':
                    uVar6 = uVar7 * uVar8 * -0x55555555 + 0x2aaaaaaa;
                    bVar17 = (uVar6 >> 1 | (uint)((uVar6 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                    break;
                  case '\x06':
                    bVar17 = (int)(uVar7 * uVar8) % 6 < 3;
                    break;
                  case '\a':
                    uVar6 = uVar7 + uVar8;
                    iVar13 = (int)(uVar7 * uVar8) % 3;
LAB_00180c85:
                    bVar17 = (iVar13 + uVar6 & 1) == 0;
                  }
                  uVar6 = uVar7;
                  if (local_98->isMirrored != false) {
                    uVar6 = uVar8;
                    uVar8 = uVar7;
                  }
                  bVar1 = BitMatrix::get(local_d0,uVar8,uVar6);
                  formatInfo = local_98;
                  bVar16 = (char)local_e8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start * '\x02' | bVar17 ^ bVar1;
                  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start =
                       (pointer)CONCAT71(local_e8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar16);
                  uVar8 = (uint)uVar12 + 1;
                  uVar12 = (ulong)uVar8;
                } while (uVar8 != 8);
                if (local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,
                             (iterator)
                             local_c8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(uchar *)&local_e8);
                  uVar12 = local_f0;
                }
                else {
                  *local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = bVar16;
                  local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       local_c8._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                  uVar12 = local_f0;
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != (uint)local_88);
          }
        }
        else {
          iVar13 = local_54 - uVar15;
          if (iVar13 < 5) {
            if (0x13 < (int)local_68) {
              uVar15 = 0;
              do {
                local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((ulong)local_e8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00
                              );
                uVar12 = 0;
                do {
                  if (7 < formatInfo->dataMask) {
                    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument(piVar5,"QRCode maskIndex out of range");
                    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  uVar9 = ((uint)(iVar13 == 4) + iVar13 * 2 + -1) - ((uint)uVar12 & 1);
                  uVar8 = (int)local_a0 - ((int)(uVar12 >> 1) + uVar15 * 4);
                  switch(formatInfo->dataMask) {
                  case '\0':
                    bVar17 = (uVar8 + uVar9 & 1) == 0;
                    break;
                  case '\x01':
                    bVar17 = (uVar8 & 1) == 0;
                    break;
                  case '\x02':
                    uVar7 = uVar9;
                    goto LAB_00180e2e;
                  case '\x03':
                    uVar7 = uVar8 + uVar9;
LAB_00180e2e:
                    bVar17 = uVar7 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                    break;
                  case '\x04':
                    uVar7 = uVar8 - ((int)uVar8 >> 0x1f) >> 1;
                    iVar3 = (int)uVar9 / 3;
                    goto LAB_00180e61;
                  case '\x05':
                    uVar7 = uVar8 * uVar9 * -0x55555555 + 0x2aaaaaaa;
                    bVar17 = (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                    break;
                  case '\x06':
                    bVar17 = (int)(uVar8 * uVar9) % 6 < 3;
                    break;
                  case '\a':
                    uVar7 = uVar8 + uVar9;
                    iVar3 = (int)(uVar8 * uVar9) % 3;
LAB_00180e61:
                    bVar17 = (iVar3 + uVar7 & 1) == 0;
                  }
                  uVar7 = uVar8;
                  if (local_98->isMirrored != false) {
                    uVar7 = uVar9;
                    uVar9 = uVar8;
                  }
                  bVar1 = BitMatrix::get(local_d0,uVar9,uVar7);
                  formatInfo = local_98;
                  bVar16 = (char)local_e8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start * '\x02' | bVar17 ^ bVar1;
                  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start =
                       (pointer)CONCAT71(local_e8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar16);
                  uVar9 = (uint)uVar12 + 1;
                  uVar12 = (ulong)uVar9;
                } while (uVar9 != 8);
                if (local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,
                             (iterator)
                             local_c8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(uchar *)&local_e8);
                }
                else {
                  *local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = bVar16;
                  local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       local_c8._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                }
                uVar15 = uVar15 + 1;
                uVar12 = local_f0;
              } while (uVar15 != local_6c);
            }
          }
          else if (1 < (int)local_68) {
            local_f4 = uVar15 * 4;
            uVar11 = 0;
            do {
              uVar15 = local_48;
              iVar13 = (int)uVar11;
              if ((iVar13 < (int)(uint)local_90 || (int)uVar12 != 2) &&
                 (((uVar12 & 1) == 0 || (int)uVar12 == (int)local_38) || iVar13 != 0)) {
                iVar3 = ~(iVar13 * 2) + (int)local_68;
                bVar17 = local_4c <= iVar13;
                local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((ulong)local_e8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00
                              );
                uVar12 = 0;
                local_40 = uVar11;
                do {
                  if (7 < formatInfo->dataMask) {
                    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument(piVar5,"QRCode maskIndex out of range");
                    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  uVar9 = uVar15 - ((uint)uVar12 & 3 | local_f4);
                  uVar8 = (iVar3 - (uint)bVar17) - (int)(uVar12 >> 2);
                  switch(formatInfo->dataMask) {
                  case '\0':
                    bVar1 = (uVar8 + uVar9 & 1) == 0;
                    break;
                  case '\x01':
                    bVar1 = (uVar8 & 1) == 0;
                    break;
                  case '\x02':
                    uVar7 = uVar9;
                    goto LAB_00181037;
                  case '\x03':
                    uVar7 = uVar8 + uVar9;
LAB_00181037:
                    bVar1 = uVar7 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                    break;
                  case '\x04':
                    uVar7 = uVar8 - ((int)uVar8 >> 0x1f) >> 1;
                    iVar13 = (int)uVar9 / 3;
                    goto LAB_0018106a;
                  case '\x05':
                    uVar7 = uVar8 * uVar9 * -0x55555555 + 0x2aaaaaaa;
                    bVar1 = (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                    break;
                  case '\x06':
                    bVar1 = (int)(uVar8 * uVar9) % 6 < 3;
                    break;
                  case '\a':
                    uVar7 = uVar8 + uVar9;
                    iVar13 = (int)(uVar8 * uVar9) % 3;
LAB_0018106a:
                    bVar1 = (iVar13 + uVar7 & 1) == 0;
                  }
                  uVar7 = uVar8;
                  if (formatInfo->isMirrored != false) {
                    uVar7 = uVar9;
                    uVar9 = uVar8;
                  }
                  bVar2 = BitMatrix::get(local_d0,uVar9,uVar7);
                  bVar16 = (char)local_e8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start * '\x02' | bVar1 ^ bVar2;
                  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start =
                       (pointer)CONCAT71(local_e8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar16);
                  uVar9 = (uint)uVar12 + 1;
                  uVar12 = (ulong)uVar9;
                } while (uVar9 != 8);
                if (local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,
                             (iterator)
                             local_c8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(uchar *)&local_e8);
                  uVar12 = local_f0;
                  uVar11 = local_40;
                }
                else {
                  *local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = bVar16;
                  local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       local_c8._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                  uVar12 = local_f0;
                  uVar11 = local_40;
                }
              }
              uVar15 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar15;
            } while (uVar15 != (uint)local_78);
          }
        }
        uVar15 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar15;
      } while (uVar15 != local_50);
    }
    *(byte *)local_c8._0_8_ = *(byte *)local_c8._0_8_ & 0xf;
    if (local_60->_totalCodewords ==
        (int)local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start - local_c8._width) {
      (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
      (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      return local_80;
    }
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar4 = local_80;
    local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pbVar14 = (byte *)local_c8._0_8_;
    if ((byte *)local_c8._0_8_ == (byte *)0x0) {
      return local_80;
    }
    goto LAB_00181808;
  case Model2:
    Version::buildFunctionPattern(&local_c8,version);
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_e8,(long)version->_totalCodewords);
    uVar10 = local_d0->_height;
    local_90 = (ulong)uVar10;
    if (1 < (int)uVar10) {
      iVar13 = uVar10 - 1;
      uVar10 = 0;
      local_88 = CONCAT71(local_88._1_7_,1);
      local_78 = CONCAT44(local_78._4_4_,iVar13);
      bVar16 = 0;
      do {
        iVar3 = iVar13;
        if (iVar13 == 6) {
          iVar3 = 5;
        }
        uVar12 = 0;
        do {
          local_f0 = CONCAT44(local_f0._4_4_,(int)uVar12);
          uVar11 = (ulong)((uint)local_78 - (int)uVar12);
          if ((local_88 & 1) == 0) {
            uVar11 = uVar12;
          }
          uVar15 = (uint)uVar11;
          local_f4 = (int)((int)(uVar11 >> 0x1f) + uVar15) >> 1;
          local_a0 = CONCAT71(local_a0._1_7_,(uVar11 & 1) == 0);
          iVar13 = 0;
          bVar17 = true;
          do {
            bVar1 = bVar17;
            uVar9 = iVar13 + iVar3;
            uVar12 = (ulong)(int)(local_c8._width * uVar15 + uVar9);
            if ((ulong)((long)local_c8._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_c8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) <= uVar12) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar12,(long)local_c8._bits.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_c8._bits.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar12] == 0) {
              bVar18 = (byte)local_a0;
              switch(local_98->dataMask) {
              case '\0':
                bVar18 = (uVar9 + uVar15 & 1) == 0;
                break;
              case '\x01':
                break;
              case '\x02':
                bVar18 = uVar9 * -0x55555555 < 0x55555556;
                break;
              case '\x03':
                bVar18 = (uVar9 + uVar15) * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                break;
              case '\x04':
                bVar18 = (uVar9 / 3 + local_f4 & 1) == 0;
                break;
              case '\x05':
                uVar8 = uVar9 * uVar15 * -0x55555555 + 0x2aaaaaaa;
                bVar18 = (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                break;
              case '\x06':
                bVar18 = (int)(uVar9 * uVar15) % 6 < 3;
                break;
              case '\a':
                bVar18 = ((int)(uVar9 * uVar15) % 3 + uVar9 + uVar15 & 1) == 0;
                break;
              default:
                piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(piVar5,"QRCode maskIndex out of range");
                __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              uVar7 = uVar9;
              uVar8 = uVar15;
              if (local_98->isMirrored == false) {
                uVar7 = uVar15;
                uVar8 = uVar9;
              }
              bVar17 = BitMatrix::get(local_d0,uVar8,uVar7);
              bVar16 = bVar16 * '\x02' | bVar18 ^ bVar17;
              uVar10 = uVar10 + 1;
              if ((uVar10 & 7) == 0) {
                local_f5 = bVar16;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>(&local_e8,&local_f5);
                bVar16 = 0;
              }
            }
            iVar13 = -1;
            bVar17 = false;
          } while (bVar1);
          uVar12 = (ulong)((int)local_f0 + 1U);
        } while ((int)local_f0 + 1U != (uint)local_90);
        local_88 = local_88 ^ 1;
        iVar13 = iVar3 + -2;
      } while (2 < iVar3);
    }
    break;
  case Micro:
    Version::buildFunctionPattern(&local_c8,version);
    bVar17 = formatInfo->ecLevel == Low;
    local_f4 = version->_versionNumber;
    iVar13 = 2;
    if (local_f4 != 1) {
      iVar13 = bVar17 + 8 + (uint)bVar17;
    }
    local_f0 = CONCAT44(local_f0._4_4_,iVar13);
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_e8,(long)version->_totalCodewords);
    uVar10 = local_d0->_height;
    local_78 = (ulong)uVar10;
    if (1 < (int)uVar10) {
      local_f4 = local_f4 & 0x80000001;
      uVar10 = uVar10 - 1;
      iVar13 = 0;
      local_90 = CONCAT71(local_90._1_7_,1);
      bVar16 = 0;
      local_6c = uVar10;
      do {
        uVar12 = (ulong)uVar10;
        iVar3 = 0;
        local_a0 = uVar12;
        do {
          local_88 = CONCAT44(local_88._4_4_,iVar3);
          y = local_6c - iVar3;
          if ((local_90 & 1) == 0) {
            y = iVar3;
          }
          iVar3 = 0;
          bVar17 = true;
          do {
            bVar1 = bVar17;
            iVar3 = iVar3 + (int)uVar12;
            uVar11 = (ulong)(local_c8._width * y + iVar3);
            if ((ulong)((long)local_c8._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_c8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) <= uVar11) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            if (local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar11] == 0) {
              local_98 = (FormatInformation *)CONCAT44(local_98._4_4_,iVar13);
              bVar17 = GetDataMaskBit((uint)formatInfo->dataMask,iVar3,y,true);
              iVar13 = iVar3;
              x = y;
              if (formatInfo->isMirrored == false) {
                iVar13 = y;
                x = iVar3;
              }
              bVar2 = BitMatrix::get(local_d0,x,iVar13);
              bVar16 = bVar16 * '\x02' | bVar17 != bVar2;
              if ((int)local_98 == 7) {
LAB_001812de:
                local_f5 = bVar16;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>(&local_e8,&local_f5);
                bVar16 = 0;
                iVar13 = 0;
                uVar12 = local_a0;
              }
              else {
                uVar12 = local_a0;
                if ((int)local_98 == 3) {
                  iVar13 = 4;
                  if (local_f4 == 1) {
                    if ((int)local_f0 ==
                        (int)local_e8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                        (int)local_e8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) goto LAB_001812de;
                  }
                }
                else {
                  iVar13 = (int)local_98 + 1;
                }
              }
            }
            iVar3 = -1;
            bVar17 = false;
          } while (bVar1);
          iVar3 = (uint)local_88 + 1;
        } while (iVar3 != (uint)local_78);
        local_90 = local_90 ^ 1;
        uVar10 = (int)uVar12 - 2;
      } while (2 < (int)uVar12);
    }
    break;
  case rMQR:
    Version::buildFunctionPattern(&local_c8,version);
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_e8,(long)version->_totalCodewords);
    uVar10 = local_d0->_width;
    if (2 < (int)uVar10) {
      uVar15 = local_d0->_height;
      uVar9 = 0;
      local_88 = CONCAT71(local_88._1_7_,1);
      bVar16 = 0;
      local_90 = CONCAT44(local_90._4_4_,uVar15);
      do {
        local_78 = (ulong)uVar10;
        uVar10 = uVar10 - 2;
        if (0 < (int)uVar15) {
          uVar8 = 0;
          do {
            local_f0 = CONCAT44(local_f0._4_4_,uVar8);
            uVar15 = ~uVar8 + uVar15;
            if ((local_88 & 1) == 0) {
              uVar15 = uVar8;
            }
            local_f4 = (int)uVar15 / 2;
            local_a0 = CONCAT71(local_a0._1_7_,(uVar15 & 1) == 0);
            iVar13 = 0;
            bVar17 = true;
            do {
              bVar1 = bVar17;
              uVar8 = iVar13 + uVar10;
              uVar12 = (ulong)(int)(local_c8._width * uVar15 + uVar8);
              if ((ulong)((long)local_c8._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_c8._bits.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) <= uVar12) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar12,(long)local_c8._bits.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_c8._bits.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12] != 0) goto LAB_00181531;
              bVar18 = (byte)local_a0;
              switch(local_98->dataMask) {
              case '\0':
                bVar18 = (uVar8 + uVar15 & 1) == 0;
                break;
              case '\x01':
                break;
              case '\x02':
                uVar7 = uVar8;
                goto LAB_00181468;
              case '\x03':
                uVar7 = uVar8 + uVar15;
LAB_00181468:
                bVar18 = uVar7 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                break;
              case '\x04':
                bVar18 = ((int)uVar8 / 3 + local_f4 & 1) == 0;
                break;
              case '\x05':
                uVar7 = uVar8 * uVar15 * -0x55555555 + 0x2aaaaaaa;
                bVar18 = (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                break;
              case '\x06':
                bVar18 = (int)(uVar8 * uVar15) % 6 < 3;
                break;
              case '\a':
                bVar18 = ((int)(uVar8 * uVar15) % 3 + uVar8 + uVar15 & 1) == 0;
                break;
              default:
                piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(piVar5,"QRCode maskIndex out of range");
                __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              uVar6 = uVar8;
              uVar7 = uVar15;
              if (local_98->isMirrored == false) {
                uVar6 = uVar15;
                uVar7 = uVar8;
              }
              bVar17 = BitMatrix::get(local_d0,uVar7,uVar6);
              bVar16 = bVar16 * '\x02' | bVar18 ^ bVar17;
              uVar9 = uVar9 + 1;
              if ((uVar9 & 7) == 0) {
                local_f5 = bVar16;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>(&local_e8,&local_f5);
                bVar16 = 0;
              }
LAB_00181531:
              iVar13 = -1;
              bVar17 = false;
            } while (bVar1);
            uVar8 = (int)local_f0 + 1;
            uVar15 = (uint)local_90;
          } while (uVar8 != (uint)local_90);
        }
        local_88 = local_88 ^ 1;
      } while (4 < (int)(uint)local_78);
    }
    break;
  default:
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  pBVar4 = local_80;
  if (local_60->_totalCodewords ==
      (int)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish -
      (int)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start) {
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  pbVar14 = local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (local_c8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
LAB_00181808:
    operator_delete(pbVar14,(long)local_c8._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar14)
    ;
  }
  return pBVar4;
}

Assistant:

ByteArray ReadCodewords(const BitMatrix& bitMatrix, const Version& version, const FormatInformation& formatInfo)
{
	switch (version.type()) {
	case Type::Micro: return ReadMQRCodewords(bitMatrix, version, formatInfo);
	case Type::rMQR: return ReadRMQRCodewords(bitMatrix, version, formatInfo);
	case Type::Model1: return ReadQRCodewordsModel1(bitMatrix, version, formatInfo);
	case Type::Model2: return ReadQRCodewords(bitMatrix, version, formatInfo);
	}

	return {};
}